

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall BasicBlock::DumpHeader(BasicBlock *this,bool insertCR)

{
  uint32 uVar1;
  code *pcVar2;
  FlowEdge **ppFVar3;
  bool bVar4;
  ImplicitCallFlags flags;
  uint uVar5;
  uint uVar6;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  undefined4 *puVar8;
  Type_conflict pSVar9;
  Type *ppFVar10;
  BasicBlock *pBVar11;
  char16 *form;
  BasicBlock *blockSucc_1;
  FlowEdge **__edge_3;
  Iterator __iter_3;
  BOOL fFirst_3;
  BasicBlock *blockPred_1;
  FlowEdge **__edge_2;
  Iterator __iter_2;
  BOOL fFirst_2;
  BasicBlock *blockSucc;
  FlowEdge **__edge_1;
  Iterator __iter_1;
  BOOL fFirst_1;
  BasicBlock *blockPred;
  FlowEdge **__edge;
  Iterator __iter;
  BOOL fFirst;
  bool insertCR_local;
  BasicBlock *this_local;
  
  __iter.current._7_1_ = insertCR;
  if (insertCR) {
    Output::Print(L"\n");
  }
  Output::Print(L"BLOCK %d:",(ulong)this->number);
  if ((*(ushort *)&this->field_0x18 >> 1 & 1) != 0) {
    Output::Print(L" **** DEAD ****");
  }
  if ((*(ushort *)&this->field_0x18 >> 8 & 1) == 0) {
    if ((*(ushort *)&this->field_0x18 >> 9 & 1) == 0) {
      if ((*(ushort *)&this->field_0x18 >> 0xb & 1) == 0) {
        if ((*(ushort *)&this->field_0x18 >> 10 & 1) == 0) {
          if ((*(ushort *)&this->field_0x18 >> 6 & 1) != 0) {
            Output::Print(L" **** Airlock block Compensation Code ****");
          }
        }
        else {
          Output::Print(L" **** Break Sink Compensation Code ****");
        }
      }
      else {
        Output::Print(L" **** Break Source Compensation Code ****");
      }
    }
    else {
      Output::Print(L" **** Air lock Block ****");
    }
  }
  else {
    Output::Print(L" **** Break Block ****");
  }
  bVar4 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Empty
                    (&(this->predList).
                      super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
  if (!bVar4) {
    __iter.current._0_4_ = 1;
    Output::Print(L" In(");
    pSVar7 = &GetPredList(this)->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    ___edge = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(pSVar7);
    while( true ) {
      if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      ppFVar3 = __edge;
      pSVar9 = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar4 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)ppFVar3,pSVar9)
      ;
      if (bVar4) break;
      SListNodeBase<Memory::ArenaAllocator>::Next
                (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      ppFVar10 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)&__edge);
      pBVar11 = FlowEdge::GetPred(*ppFVar10);
      if (pBVar11 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0xfe1,"(blockPred)","blockPred");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      if ((int)__iter.current == 0) {
        Output::Print(L", ");
      }
      uVar5 = GetBlockNum(pBVar11);
      Output::Print(L"%d",(ulong)uVar5);
      __iter.current._0_4_ = 0;
    }
    Output::Print(L")");
  }
  bVar4 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Empty
                    (&(this->succList).
                      super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
  if (!bVar4) {
    __iter_1.current._4_4_ = 1;
    Output::Print(L" Out(");
    pSVar7 = &GetSuccList(this)->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    ___edge_1 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(pSVar7);
    while( true ) {
      if (__iter_1.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      ppFVar3 = __edge_1;
      pSVar9 = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar4 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)ppFVar3,pSVar9)
      ;
      if (bVar4) break;
      SListNodeBase<Memory::ArenaAllocator>::Next
                (&(__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      ppFVar10 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)&__edge_1);
      pBVar11 = FlowEdge::GetSucc(*ppFVar10);
      if (pBVar11 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0xff3,"(blockSucc)","blockSucc");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      if (__iter_1.current._4_4_ == 0) {
        Output::Print(L", ");
      }
      uVar5 = GetBlockNum(pBVar11);
      Output::Print(L"%d",(ulong)uVar5);
      __iter_1.current._4_4_ = 0;
    }
    Output::Print(L")");
  }
  bVar4 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Empty
                    (&(this->deadPredList).
                      super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
  if (!bVar4) {
    __iter_2.current._4_4_ = 1;
    Output::Print(L" DeadIn(");
    pSVar7 = &GetDeadPredList(this)->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    ___edge_2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(pSVar7);
    while( true ) {
      if (__iter_2.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      ppFVar3 = __edge_2;
      pSVar9 = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(__iter_2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar4 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)ppFVar3,pSVar9)
      ;
      if (bVar4) break;
      SListNodeBase<Memory::ArenaAllocator>::Next
                (&(__iter_2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      ppFVar10 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)&__edge_2);
      pBVar11 = FlowEdge::GetPred(*ppFVar10);
      if (pBVar11 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x1004,"(blockPred)","blockPred");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      if (__iter_2.current._4_4_ == 0) {
        Output::Print(L", ");
      }
      uVar5 = GetBlockNum(pBVar11);
      Output::Print(L"%d",(ulong)uVar5);
      __iter_2.current._4_4_ = 0;
    }
    Output::Print(L")");
  }
  bVar4 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Empty
                    (&(this->deadSuccList).
                      super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
  if (!bVar4) {
    __iter_3.current._4_4_ = 1;
    Output::Print(L" DeadOut(");
    pSVar7 = &GetDeadSuccList(this)->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    ___edge_3 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(pSVar7);
    while( true ) {
      if (__iter_3.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      ppFVar3 = __edge_3;
      pSVar9 = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(__iter_3.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar4 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)ppFVar3,pSVar9)
      ;
      if (bVar4) break;
      SListNodeBase<Memory::ArenaAllocator>::Next
                (&(__iter_3.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      ppFVar10 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)&__edge_3);
      pBVar11 = FlowEdge::GetSucc(*ppFVar10);
      if (pBVar11 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x1015,"(blockSucc)","blockSucc");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      if (__iter_3.current._4_4_ == 0) {
        Output::Print(L", ");
      }
      uVar5 = GetBlockNum(pBVar11);
      Output::Print(L"%d",(ulong)uVar5);
      __iter_3.current._4_4_ = 0;
    }
    Output::Print(L")");
  }
  if (this->loop != (Loop *)0x0) {
    uVar1 = this->loop->loopNumber;
    pBVar11 = Loop::GetHeadBlock(this->loop);
    uVar5 = GetBlockNum(pBVar11);
    Output::Print(L"   Loop(%d) header: %d",(ulong)(uVar1 - 1),(ulong)uVar5);
    if (this->loop->parent != (Loop *)0x0) {
      uVar5 = this->loop->parent->loopNumber;
      pBVar11 = Loop::GetHeadBlock(this->loop->parent);
      uVar6 = GetBlockNum(pBVar11);
      Output::Print(L" parent(%d): %d",(ulong)uVar5,(ulong)uVar6);
    }
    pBVar11 = Loop::GetHeadBlock(this->loop);
    if (pBVar11 == this) {
      Output::SkipToColumn(0x32);
      Output::Print(L"Call Exp/Imp: ");
      bVar4 = Loop::GetHasCall(this->loop);
      if (bVar4) {
        Output::Print(L"yes/");
      }
      else {
        Output::Print(L" no/");
      }
      flags = Loop::GetImplicitCallFlags(this->loop);
      form = Js::DynamicProfileInfo::GetImplicitCallFlagsString(flags);
      Output::Print(form);
    }
  }
  Output::Print(L"\n");
  if ((__iter.current._7_1_ & 1) != 0) {
    Output::Print(L"\n");
  }
  return;
}

Assistant:

void
BasicBlock::DumpHeader(bool insertCR)
{
    if (insertCR)
    {
        Output::Print(_u("\n"));
    }
    Output::Print(_u("BLOCK %d:"), this->number);

    if (this->isDead)
    {
        Output::Print(_u(" **** DEAD ****"));
    }

    if (this->isBreakBlock)
    {
        Output::Print(_u(" **** Break Block ****"));
    }
    else if (this->isAirLockBlock)
    {
        Output::Print(_u(" **** Air lock Block ****"));
    }
    else if (this->isBreakCompensationBlockAtSource)
    {
        Output::Print(_u(" **** Break Source Compensation Code ****"));
    }
    else if (this->isBreakCompensationBlockAtSink)
    {
        Output::Print(_u(" **** Break Sink Compensation Code ****"));
    }
    else if (this->isAirLockCompensationBlock)
    {
        Output::Print(_u(" **** Airlock block Compensation Code ****"));
    }

    if (!this->predList.Empty())
    {
        BOOL fFirst = TRUE;
        Output::Print(_u(" In("));
        FOREACH_PREDECESSOR_BLOCK(blockPred, this)
        {
            if (!fFirst)
            {
                Output::Print(_u(", "));
            }
            Output::Print(_u("%d"), blockPred->GetBlockNum());
            fFirst = FALSE;
        }
        NEXT_PREDECESSOR_BLOCK;
        Output::Print(_u(")"));
    }


    if (!this->succList.Empty())
    {
        BOOL fFirst = TRUE;
        Output::Print(_u(" Out("));
        FOREACH_SUCCESSOR_BLOCK(blockSucc, this)
        {
            if (!fFirst)
            {
                Output::Print(_u(", "));
            }
            Output::Print(_u("%d"), blockSucc->GetBlockNum());
            fFirst = FALSE;
        }
        NEXT_SUCCESSOR_BLOCK;
        Output::Print(_u(")"));
    }

    if (!this->deadPredList.Empty())
    {
        BOOL fFirst = TRUE;
        Output::Print(_u(" DeadIn("));
        FOREACH_DEAD_PREDECESSOR_BLOCK(blockPred, this)
        {
            if (!fFirst)
            {
                Output::Print(_u(", "));
            }
            Output::Print(_u("%d"), blockPred->GetBlockNum());
            fFirst = FALSE;
        }
        NEXT_DEAD_PREDECESSOR_BLOCK;
        Output::Print(_u(")"));
    }

    if (!this->deadSuccList.Empty())
    {
        BOOL fFirst = TRUE;
        Output::Print(_u(" DeadOut("));
        FOREACH_DEAD_SUCCESSOR_BLOCK(blockSucc, this)
        {
            if (!fFirst)
            {
                Output::Print(_u(", "));
            }
            Output::Print(_u("%d"), blockSucc->GetBlockNum());
            fFirst = FALSE;
        }
        NEXT_DEAD_SUCCESSOR_BLOCK;
        Output::Print(_u(")"));
    }

    if (this->loop)
    {
        Output::Print(_u("   Loop(%d) header: %d"), this->loop->loopNumber - 1, this->loop->GetHeadBlock()->GetBlockNum());

        if (this->loop->parent)
        {
            Output::Print(_u(" parent(%d): %d"), this->loop->parent->loopNumber, this->loop->parent->GetHeadBlock()->GetBlockNum());
        }

        if (this->loop->GetHeadBlock() == this)
        {
            Output::SkipToColumn(50);
            Output::Print(_u("Call Exp/Imp: "));
            if (this->loop->GetHasCall())
            {
                Output::Print(_u("yes/"));
            }
            else
            {
                Output::Print(_u(" no/"));
            }
            Output::Print(Js::DynamicProfileInfo::GetImplicitCallFlagsString(this->loop->GetImplicitCallFlags()));
        }
    }

    Output::Print(_u("\n"));
    if (insertCR)
    {
        Output::Print(_u("\n"));
    }
}